

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psllh_mips64(uint64_t fs,uint64_t ft)

{
  undefined1 auVar1 [12];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar4 [16];
  undefined2 uVar7;
  
  uVar2 = (uint)ft & 0x7f;
  if (0xf < uVar2) {
    return 0;
  }
  uVar7 = (undefined2)(fs >> 0x30);
  auVar4._8_4_ = 0;
  auVar4._0_8_ = fs;
  auVar4._12_2_ = uVar7;
  auVar4._14_2_ = uVar7;
  uVar7 = (undefined2)(fs >> 0x20);
  auVar3._12_4_ = auVar4._12_4_;
  auVar3._8_2_ = 0;
  auVar3._0_8_ = fs;
  auVar3._10_2_ = uVar7;
  auVar6._10_6_ = auVar3._10_6_;
  auVar6._8_2_ = uVar7;
  auVar6._0_8_ = fs;
  uVar7 = (undefined2)(fs >> 0x10);
  auVar1._4_8_ = auVar6._8_8_;
  auVar1._2_2_ = uVar7;
  auVar1._0_2_ = uVar7;
  auVar5._0_4_ = CONCAT22((short)fs,(short)fs) << uVar2;
  auVar5._4_4_ = auVar1._0_4_;
  auVar5._8_4_ = auVar6._8_4_;
  auVar5._12_4_ = auVar3._12_4_;
  auVar6 = pshuflw(auVar5,auVar5,0xe8);
  auVar6 = pshufhw(auVar6,auVar6,0xe8);
  return CONCAT44(auVar6._8_4_,auVar6._0_4_);
}

Assistant:

uint64_t helper_psllh(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 15) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 4; ++i) {
        vs.uh[i] <<= ft;
    }
    return vs.d;
}